

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

Reader * __thiscall
capnp::DynamicList::Reader::operator[](Reader *__return_storage_ptr__,Reader *this,uint index)

{
  double dVar1;
  byte bVar2;
  undefined2 uVar3;
  uint uVar4;
  int iVar5;
  byte *pbVar6;
  CapTableReader *pCVar7;
  undefined8 uVar8;
  ElementSize expectedElementSize;
  Which WVar9;
  StructSchema SVar10;
  ulong uVar11;
  EnumSchema EVar12;
  InterfaceSchema IVar13;
  Type TVar14;
  ArrayPtr<const_unsigned_char> AVar15;
  Fault f;
  undefined1 local_b8 [24];
  undefined8 local_a0;
  Schema local_98;
  StructReader local_90;
  ListReader local_60;
  
  if ((this->reader).elementCount <= index) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x410,FAILED,"index < size()","\"List index out-of-bounds.\"",
               (char (*) [26])"List index out-of-bounds.");
    kj::_::Debug::Fault::fatal(&f);
  }
  WVar9 = LIST;
  if ((this->schema).elementType.listDepth == '\0') {
    WVar9 = (this->schema).elementType.baseType;
  }
  switch(WVar9) {
  case VOID:
    __return_storage_ptr__->type = VOID;
    break;
  case BOOL:
    bVar2 = (this->reader).ptr[index >> 3];
    __return_storage_ptr__->type = BOOL;
    (__return_storage_ptr__->field_1).boolValue = (bVar2 >> (index & 7) & 1) != 0;
    break;
  case INT8:
    uVar11 = (ulong)(char)(this->reader).ptr[(ulong)(this->reader).step * (ulong)index >> 3];
    goto LAB_00437842;
  case INT16:
    uVar11 = (ulong)*(short *)((this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3)
                              );
    goto LAB_00437842;
  case INT32:
    uVar11 = (ulong)*(int *)((this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3));
    goto LAB_00437842;
  case INT64:
    uVar11 = *(ulong *)((this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3));
LAB_00437842:
    __return_storage_ptr__->type = INT;
LAB_00437918:
    (__return_storage_ptr__->field_1).intValue = uVar11;
    break;
  case UINT8:
    uVar11 = (ulong)(this->reader).ptr[(ulong)(this->reader).step * (ulong)index >> 3];
    goto LAB_00437912;
  case UINT16:
    uVar11 = (ulong)*(ushort *)
                     ((this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3));
    goto LAB_00437912;
  case UINT32:
    uVar11 = (ulong)*(uint *)((this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3))
    ;
    goto LAB_00437912;
  case UINT64:
    uVar11 = *(ulong *)((this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3));
LAB_00437912:
    __return_storage_ptr__->type = UINT;
    goto LAB_00437918;
  case FLOAT32:
    dVar1 = (double)*(float *)((this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3)
                              );
    goto LAB_004378f0;
  case FLOAT64:
    dVar1 = *(double *)((this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3));
LAB_004378f0:
    __return_storage_ptr__->type = FLOAT;
    (__return_storage_ptr__->field_1).intValue = (int64_t)dVar1;
    break;
  case TEXT:
    f.exception = (Exception *)(this->reader).segment;
    AVar15 = (ArrayPtr<const_unsigned_char>)
             capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)&f,(void *)0x0,0);
    __return_storage_ptr__->type = TEXT;
    goto LAB_00437886;
  case DATA:
    f.exception = (Exception *)(this->reader).segment;
    AVar15 = (ArrayPtr<const_unsigned_char>)
             capnp::_::PointerReader::getBlob<capnp::Data>((PointerReader *)&f,(void *)0x0,0);
    __return_storage_ptr__->type = DATA;
LAB_00437886:
    (__return_storage_ptr__->field_1).dataValue.super_ArrayPtr<const_unsigned_char> = AVar15;
    break;
  case LIST:
    TVar14 = (Type)Type::asList((Type *)this);
    f.exception = (Exception *)(this->reader).segment;
    WVar9 = LIST;
    if (((undefined1  [16])TVar14 & (undefined1  [16])0xff0000) == (undefined1  [16])0x0) {
      WVar9 = TVar14.baseType;
    }
    expectedElementSize = anon_unknown_71::elementSizeFor(WVar9);
    capnp::_::PointerReader::getList(&local_60,(PointerReader *)&f,expectedElementSize,(word *)0x0);
    *(StructDataBitCount *)((long)&__return_storage_ptr__->field_1 + 0x30) = local_60.structDataSize
    ;
    *(StructPointerCount *)((long)&__return_storage_ptr__->field_1 + 0x34) =
         local_60.structPointerCount;
    *(ElementSize *)((long)&__return_storage_ptr__->field_1 + 0x36) = local_60.elementSize;
    *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x37) = local_60._39_1_;
    *(int *)((long)&__return_storage_ptr__->field_1 + 0x38) = local_60.nestingLimit;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0x3c) = local_60._44_4_;
    (__return_storage_ptr__->field_1).listValue.reader.ptr = local_60.ptr;
    *(ListElementCount *)((long)&__return_storage_ptr__->field_1 + 0x28) = local_60.elementCount;
    *(BitsPerElementN<23> *)((long)&__return_storage_ptr__->field_1 + 0x2c) = local_60.step;
    (__return_storage_ptr__->field_1).listValue.reader.segment = local_60.segment;
    (__return_storage_ptr__->field_1).listValue.reader.capTable = local_60.capTable;
    __return_storage_ptr__->type = LIST;
    (__return_storage_ptr__->field_1).listValue.schema.elementType = TVar14;
    break;
  case ENUM:
    EVar12 = Type::asEnum((Type *)this);
    uVar3 = *(undefined2 *)((this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3));
    __return_storage_ptr__->type = ENUM;
    (__return_storage_ptr__->field_1).enumValue.schema.super_Schema.raw =
         (RawBrandedSchema *)EVar12.super_Schema.raw;
    *(undefined2 *)&(__return_storage_ptr__->field_1).listValue.schema.elementType.field_4 = uVar3;
    break;
  case STRUCT:
    SVar10 = Type::asStruct((Type *)this);
    capnp::_::ListReader::getStructElement(&local_90,&this->reader,index);
    *(undefined8 *)&(__return_storage_ptr__->field_1).listValue.reader.elementCount =
         local_90._32_8_;
    *(int *)((long)&__return_storage_ptr__->field_1 + 0x30) = local_90.nestingLimit;
    *(undefined2 *)((long)&__return_storage_ptr__->field_1 + 0x34) = local_90._44_2_;
    *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x36) = local_90._46_1_;
    *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x37) = local_90._47_1_;
    (__return_storage_ptr__->field_1).listValue.reader.capTable = (CapTableReader *)local_90.data;
    (__return_storage_ptr__->field_1).listValue.reader.ptr = (byte *)local_90.pointers;
    (__return_storage_ptr__->field_1).textValue.super_StringPtr.content.size_ =
         (size_t)local_90.segment;
    (__return_storage_ptr__->field_1).listValue.reader.segment = (SegmentReader *)local_90.capTable;
    __return_storage_ptr__->type = STRUCT;
    (__return_storage_ptr__->field_1).structValue.schema.super_Schema.raw =
         (RawBrandedSchema *)SVar10.super_Schema.raw;
    break;
  case INTERFACE:
    IVar13 = Type::asInterface((Type *)this);
    f.exception = (Exception *)(this->reader).segment;
    capnp::_::PointerReader::getCapability((PointerReader *)local_b8);
    uVar8 = local_b8._8_8_;
    local_b8._16_8_ = local_b8._0_8_;
    local_b8._8_8_ = (CapTableReader *)0x0;
    __return_storage_ptr__->type = CAPABILITY;
    (__return_storage_ptr__->field_1).intValue = local_b8._0_8_;
    (__return_storage_ptr__->field_1).textValue.super_StringPtr.content.size_ = uVar8;
    local_a0._0_4_ = 0;
    local_a0._4_4_ = 0;
    (__return_storage_ptr__->field_1).capabilityValue.schema.super_Schema.raw =
         (RawBrandedSchema *)IVar13.super_Schema.raw;
    local_98 = IVar13.super_Schema.raw;
    kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)(local_b8 + 0x10));
    kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)local_b8);
    break;
  case ANY_POINTER:
    uVar4 = (this->reader).step;
    iVar5 = (this->reader).nestingLimit;
    pbVar6 = (this->reader).ptr;
    __return_storage_ptr__->type = ANY_POINTER;
    pCVar7 = (this->reader).capTable;
    (__return_storage_ptr__->field_1).intValue = (int64_t)(this->reader).segment;
    (__return_storage_ptr__->field_1).textValue.super_StringPtr.content.size_ = (size_t)pCVar7;
    (__return_storage_ptr__->field_1).listValue.reader.segment =
         (SegmentReader *)(pbVar6 + ((ulong)uVar4 * (ulong)index >> 3));
    *(int *)((long)&__return_storage_ptr__->field_1 + 0x18) = iVar5;
    break;
  default:
    __return_storage_ptr__->type = UNKNOWN;
  }
  return __return_storage_ptr__;
}

Assistant:

DynamicValue::Reader DynamicList::Reader::operator[](uint index) const {
  KJ_REQUIRE(index < size(), "List index out-of-bounds.");

  switch (schema.whichElementType()) {
#define HANDLE_TYPE(name, discrim, typeName) \
    case schema::Type::discrim: \
      return reader.getDataElement<typeName>(bounded(index) * ELEMENTS);

    HANDLE_TYPE(void, VOID, Void)
    HANDLE_TYPE(bool, BOOL, bool)
    HANDLE_TYPE(int8, INT8, int8_t)
    HANDLE_TYPE(int16, INT16, int16_t)
    HANDLE_TYPE(int32, INT32, int32_t)
    HANDLE_TYPE(int64, INT64, int64_t)
    HANDLE_TYPE(uint8, UINT8, uint8_t)
    HANDLE_TYPE(uint16, UINT16, uint16_t)
    HANDLE_TYPE(uint32, UINT32, uint32_t)
    HANDLE_TYPE(uint64, UINT64, uint64_t)
    HANDLE_TYPE(float32, FLOAT32, float)
    HANDLE_TYPE(float64, FLOAT64, double)
#undef HANDLE_TYPE

    case schema::Type::TEXT:
      return reader.getPointerElement(bounded(index) * ELEMENTS)
                   .getBlob<Text>(nullptr, ZERO * BYTES);
    case schema::Type::DATA:
      return reader.getPointerElement(bounded(index) * ELEMENTS)
                   .getBlob<Data>(nullptr, ZERO * BYTES);

    case schema::Type::LIST: {
      auto elementType = schema.getListElementType();
      return DynamicList::Reader(elementType,
          reader.getPointerElement(bounded(index) * ELEMENTS)
                .getList(elementSizeFor(elementType.whichElementType()), nullptr));
    }

    case schema::Type::STRUCT:
      return DynamicStruct::Reader(schema.getStructElementType(),
                                   reader.getStructElement(bounded(index) * ELEMENTS));

    case schema::Type::ENUM:
      return DynamicEnum(schema.getEnumElementType(),
                         reader.getDataElement<uint16_t>(bounded(index) * ELEMENTS));

    case schema::Type::ANY_POINTER:
      return AnyPointer::Reader(reader.getPointerElement(bounded(index) * ELEMENTS));

    case schema::Type::INTERFACE:
      return DynamicCapability::Client(schema.getInterfaceElementType(),
                                       reader.getPointerElement(bounded(index) * ELEMENTS)
                                             .getCapability());
  }

  return nullptr;
}